

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

bool boost::xpressive::cpp_regex_traits<char>::compare_<char_const*>
               (char_type *name,char *begin,char *end)

{
  bool local_22;
  char *end_local;
  char *begin_local;
  char_type *name_local;
  
  begin_local = begin;
  name_local = name;
  while( true ) {
    if (*name_local == '\0' || begin_local == end) {
      local_22 = *name_local == '\0' && begin_local == end;
      return local_22;
    }
    if (*name_local != *begin_local) break;
    name_local = name_local + 1;
    begin_local = begin_local + 1;
  }
  return false;
}

Assistant:

static bool compare_(char_type const *name, FwdIter begin, FwdIter end)
    {
        for(; *name && begin != end; ++name, ++begin)
        {
            if(*name != *begin)
            {
                return false;
            }
        }
        return !*name && begin == end;
    }